

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_heap.cpp
# Opt level: O2

ON_SubDFace * __thiscall
ON_SubD_FixedSizeHeap::Internal_AllocateFace
          (ON_SubD_FixedSizeHeap *this,uint level_zero_face_id,uint parent_face_id)

{
  uint uVar1;
  ON_SubDFace *pOVar2;
  ON_SubDFace *this_00;
  
  if ((this->m_f == (ON_SubDFace *)0x0) || (this->m_f_capacity <= this->m_f_index)) {
    ON_SubDIncrementErrorCount();
    this_00 = (ON_SubDFace *)0x0;
  }
  else {
    this_00 = this->m_f + this->m_f_index;
    memset(this_00,0,0xd8);
    uVar1 = this->m_f_index;
    if (uVar1 != 0) {
      pOVar2 = this->m_f;
      pOVar2[uVar1 - 1].m_next_face = this_00;
      this_00->m_prev_face = pOVar2 + (uVar1 - 1);
    }
    this->m_f_index = uVar1 + 1;
    (this_00->super_ON_SubDComponentBase).m_id = uVar1 + 1;
    ON_SubDFace::ClearPerFaceColor(this_00);
    if (level_zero_face_id != 0) {
      parent_face_id = level_zero_face_id;
    }
    this_00->m_level_zero_face_id = parent_face_id;
  }
  return this_00;
}

Assistant:

ON_SubDFace* ON_SubD_FixedSizeHeap::Internal_AllocateFace(
  unsigned int level_zero_face_id,
  unsigned int parent_face_id
  )
{
  if (nullptr == m_f || m_f_index >= m_f_capacity)
    return ON_SUBD_RETURN_ERROR(nullptr);
  ON_SubDFace* f = m_f + m_f_index;
  memset(f, 0, sizeof(*f));
  if (m_f_index > 0)
  {
    // code in ON_SubDFaceNeighborhood.Subdivide() relies on
    // m_next_face being set this way.
    m_f[m_f_index-1].m_next_face = f;
    f->m_prev_face = &m_f[m_f_index-1];
  }

  f->m_id = ++m_f_index;
  f->ClearPerFaceColor();
  f->m_level_zero_face_id = (0 == level_zero_face_id) ? parent_face_id : level_zero_face_id;

  return f;
}